

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp4.c
# Opt level: O3

ReturnCode expand(Global *global,DEFBUF *tokenp)

{
  char *pcVar1;
  int iVar2;
  ReturnCode RVar3;
  fileinfo *pfVar4;
  FILEINFO *pFVar5;
  Global *pGVar6;
  char *pcVar7;
  int iVar8;
  
  iVar8 = global->recursion;
  iVar2 = iVar8 + 1;
  global->recursion = iVar2;
  if (iVar8 == 0) {
    global->macro = tokenp;
  }
  else if ((iVar2 == 1000) &&
          (cerror(global,ERROR_RECURSIVE_MACRO,tokenp->name,global->macro->name),
          global->rec_recover != 0)) {
    do {
      get(global);
      if (global->infile == (FILEINFO *)0x0) break;
    } while (global->infile->fp == (FILE *)0x0);
    unget(global);
    global->recursion = 0;
    return FPP_OK;
  }
  global->nargs = 0;
  global->parmp = global->parm;
  switch(tokenp->nargs) {
  case -5:
    sprintf(global->work,"%d",(ulong)(uint)global->funcline);
    goto LAB_00104895;
  case -4:
    pcVar7 = "<unknown function>";
    if (*global->functionname != '\0') {
      pcVar7 = global->functionname;
    }
    break;
  case -3:
    pFVar5 = global->infile;
    while( true ) {
      if (pFVar5 == (FILEINFO *)0x0) {
        return FPP_OK;
      }
      if (pFVar5->fp != (FILE *)0x0) break;
      pFVar5 = pFVar5->parent;
    }
    pcVar7 = pFVar5->progname;
    if (pFVar5->progname == (char *)0x0) {
      pcVar7 = pFVar5->filename;
    }
    break;
  case -2:
    pfVar4 = global->infile;
    pGVar6 = global;
    if (pfVar4->fp == (FILE *)0x0) {
      do {
        if (pfVar4->fp != (FILE *)0x0) {
          pGVar6 = (Global *)&pfVar4->line;
          goto LAB_0010483d;
        }
        pfVar4 = pfVar4->parent;
      } while (pfVar4 != (fileinfo *)0x0);
    }
    else {
LAB_0010483d:
      sprintf(global->work,"%d",(ulong)(uint)pGVar6->line);
    }
    RVar3 = ungetstring(global,global->work);
    if (RVar3 != FPP_OK) {
      return RVar3;
    }
    return FPP_OK;
  default:
    if (tokenp->nargs < 0) {
      cerror(global,FATAL_ILLEGAL_MACRO,tokenp->name);
      return FPP_ILLEGAL_MACRO;
    }
    while (iVar2 = skipws(global), iVar2 == 10) {
      global->wrongline = 1;
    }
    if (iVar2 != 0x28) {
      unget(global);
      cerror(global,WARN_MACRO_NEEDS_ARGUMENTS,tokenp->name);
      Putstring(global,tokenp->name);
      return FPP_OK;
    }
    pcVar7 = global->parm + 0x400;
    while( true ) {
      while (iVar2 = skipws(global), iVar2 == 10) {
        global->wrongline = 1;
      }
      if (iVar2 == 0x29) break;
      iVar8 = global->nargs;
      if (0x1e < (long)iVar8) {
        cerror(global,FATAL_TOO_MANY_ARGUMENTS_EXPANSION);
        return FPP_TOO_MANY_ARGUMENTS;
      }
      global->nargs = iVar8 + 1;
      global->parlist[iVar8] = global->parmp;
      iVar8 = 0;
LAB_00104948:
      if (iVar2 == 0x5c) {
        pcVar1 = global->parmp;
        if (pcVar1 < pcVar7) {
          global->parmp = pcVar1 + 1;
          *pcVar1 = '\\';
        }
        else {
          cerror(global,FATAL_MACRO_AREA_OVERFLOW);
        }
        iVar2 = cget(global);
LAB_001049b1:
        pcVar1 = global->parmp;
        if (pcVar1 < pcVar7) {
          global->parmp = pcVar1 + 1;
          *pcVar1 = (char)iVar2;
        }
        else {
          cerror(global,FATAL_MACRO_AREA_OVERFLOW);
        }
LAB_001049db:
        iVar2 = cget(global);
        goto LAB_00104948;
      }
      if (iVar2 == 0) {
        cerror(global,ERROR_EOF_IN_ARGUMENT);
        return FPP_EOF_IN_MACRO;
      }
      if (type[iVar2] == 'A') {
        RVar3 = scanstring(global,iVar2,charput);
        if (RVar3 != FPP_OK) {
          return RVar3;
        }
        goto LAB_001049db;
      }
      if (iVar2 != 0x29) {
        if (iVar2 == 0x28) {
          iVar8 = iVar8 + 1;
        }
        else {
          if (iVar2 == 0x2c && iVar8 == 0) goto LAB_00104a2d;
          if (iVar2 == 10) {
            global->wrongline = 1;
          }
        }
        goto LAB_001049b1;
      }
      if (iVar8 != 0) {
        iVar8 = iVar8 + -1;
        goto LAB_001049b1;
      }
      unget(global);
LAB_00104a2d:
      pcVar1 = global->parmp;
      if (pcVar1 < pcVar7) {
        global->parmp = pcVar1 + 1;
        *pcVar1 = '\0';
      }
      else {
        cerror(global,FATAL_MACRO_AREA_OVERFLOW);
      }
    }
    *global->parmp = '\0';
    if (tokenp->nargs != global->nargs) {
      cerror(global,WARN_WRONG_NUMBER_ARGUMENTS,tokenp->name);
    }
  case -1:
    RVar3 = expstuff(global,tokenp->name,tokenp->repl);
    return RVar3;
  }
  sprintf(global->work,"\"%s\"",pcVar7);
LAB_00104895:
  RVar3 = ungetstring(global,global->work);
  if (RVar3 != FPP_OK) {
    return RVar3;
  }
  return FPP_OK;
}

Assistant:

ReturnCode expand(struct Global *global, DEFBUF *tokenp)
{
  /*
   * Expand a macro.  Called from the cpp mainline routine (via subroutine
   * macroid()) when a token is found in the symbol table.  It calls
   * expcollect() to parse actual parameters, checking for the correct number.
   * It then creates a "file" containing a single line containing the
   * macro with actual parameters inserted appropriately.  This is
   * "pushed back" onto the input stream.  (When the get() routine runs
   * off the end of the macro line, it will dismiss the macro itself.)
   */
  int c;
  FILEINFO *file;
  ReturnCode ret=FPP_OK;
      
  /*
   * If no macro is pending, save the name of this macro
   * for an eventual error message.
   */
  if (global->recursion++ == 0)
    global->macro = tokenp;
  else if (global->recursion == RECURSION_LIMIT) {
    cerror(global, ERROR_RECURSIVE_MACRO, tokenp->name, global->macro->name);
    if (global->rec_recover) {
      do {
	c = get(global);
      } while (global->infile != NULL && global->infile->fp == NULL);
      unget(global);
      global->recursion = 0;
      return(FPP_OK);
    }
  }
  /*
   * Here's a macro to expand.
   */
  global->nargs = 0;			/* Formals counter	*/
  global->parmp = global->parm;		/* Setup parm buffer	*/
  switch (tokenp->nargs) {
  case (-2):                              /* __LINE__             */
      if(global->infile->fp)
	  /* This is a file */
	  sprintf(global->work, "%d", global->line);
      else
	  /* This is a macro! Find out the file line number! */
	  for (file = global->infile; file != NULL; file = file->parent) {
	      if (file->fp != NULL) {
		  sprintf(global->work, "%d", file->line);
		  break;
	      }
	  }
      ret=ungetstring(global, global->work);
      if(ret)
	  return(ret);
      break;
    
  case (-3):                              /* __FILE__             */
    for (file = global->infile; file != NULL; file = file->parent) {
      if (file->fp != NULL) {
	sprintf(global->work, "\"%s\"", (file->progname != NULL)
		? file->progname : file->filename);
	ret=ungetstring(global, global->work);
	if(ret)
	  return(ret);
	break;
      }
    }
    break;

  case (-4):				/* __FUNC__ */
    sprintf(global->work, "\"%s\"", global->functionname[0]?
	    global->functionname : "<unknown function>");
    ret=ungetstring(global, global->work);
    if(ret)
	return(ret);
    break;

  case (-5):                              /* __FUNC_LINE__ */
    sprintf(global->work, "%d", global->funcline);
    ret=ungetstring(global, global->work);
    if(ret)
      return(ret);
    break;

  default:
    /*
     * Nothing funny about this macro.
     */
    if (tokenp->nargs < 0) {
      cfatal(global, FATAL_ILLEGAL_MACRO, tokenp->name);
      return(FPP_ILLEGAL_MACRO);
    }
    while ((c = skipws(global)) == '\n')      /* Look for (, skipping */
      global->wrongline = TRUE;		/* spaces and newlines	*/
    if (c != '(') {
      /*
       * If the programmer writes
       *	#define foo() ...
       *	...
       *	foo [no ()]
       * just write foo to the output stream.
       */
      unget(global);
      cwarn(global, WARN_MACRO_NEEDS_ARGUMENTS, tokenp->name);

      /* fputs(tokenp->name, stdout); */
      Putstring(global, tokenp->name);
      return(FPP_OK);
    } else if (!(ret=expcollect(global))) {     /* Collect arguments    */
      if (tokenp->nargs != global->nargs) {     /* Should be an error?  */
	cwarn(global, WARN_WRONG_NUMBER_ARGUMENTS, tokenp->name);
      }
    } else {				/* Collect arguments		*/
      return(ret); /* We failed in argument colleting! */
    }
  case DEF_NOARGS:			/* No parameters just stuffs	*/
    ret=expstuff(global, tokenp->name, tokenp->repl); /* expand macro   */
  }					/* nargs switch 		*/
  return(ret);
}